

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O0

void serialization::
     serialize_unpack<char_const*const*,serialization::json_oarchive,std::__cxx11::string_const&,int_const&>
               (char ***arg,json_oarchive *ar,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *front,int *next)

{
  char *key_00;
  char *key;
  int *piStack_28;
  serialization_trace trace;
  int *next_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *front_local;
  json_oarchive *ar_local;
  char ***arg_local;
  
  key._0_4_ = 0x15;
  piStack_28 = next;
  serialization_trace::serialization_trace<char_const(&)[17],char_const(&)[140],int>
            ((serialization_trace *)((long)&key + 7),(char (*) [17])0x14cc54,
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_unpack.h"
             ,(int *)&key);
  key_00 = **arg;
  json_oarchive::save_key_start(ar,key_00);
  serialize_helper<serialization::json_oarchive,std::__cxx11::string>(ar,front);
  json_oarchive::save_key_end(ar,key_00);
  *arg = *arg + 1;
  serialize_unpack<char_const*const*&,serialization::json_oarchive,int_const&>(arg,ar,piStack_28);
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}